

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfKeyCodeAttribute.cpp
# Opt level: O0

void __thiscall
Imf_3_3::TypedAttribute<Imf_3_3::KeyCode>::readValueFrom
          (TypedAttribute<Imf_3_3::KeyCode> *this,IStream *is,int size,int version)

{
  int *in_RDI;
  KeyCode *unaff_retaddr;
  int tmp;
  IStream *in_stack_ffffffffffffffe0;
  int *piVar1;
  int filmMfcCode;
  
  piVar1 = in_RDI;
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_stack_ffffffffffffffe0,in_RDI);
  filmMfcCode = (int)((ulong)piVar1 >> 0x20);
  KeyCode::setFilmMfcCode(unaff_retaddr,filmMfcCode);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_stack_ffffffffffffffe0,in_RDI);
  KeyCode::setFilmType(unaff_retaddr,filmMfcCode);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_stack_ffffffffffffffe0,in_RDI);
  KeyCode::setPrefix(unaff_retaddr,filmMfcCode);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_stack_ffffffffffffffe0,in_RDI);
  KeyCode::setCount(unaff_retaddr,filmMfcCode);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_stack_ffffffffffffffe0,in_RDI);
  KeyCode::setPerfOffset(unaff_retaddr,filmMfcCode);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_stack_ffffffffffffffe0,in_RDI);
  KeyCode::setPerfsPerFrame(unaff_retaddr,filmMfcCode);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_stack_ffffffffffffffe0,in_RDI);
  KeyCode::setPerfsPerCount(unaff_retaddr,filmMfcCode);
  return;
}

Assistant:

IMF_EXPORT void
KeyCodeAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    int tmp;

    Xdr::read<StreamIO> (is, tmp);
    _value.setFilmMfcCode (tmp);

    Xdr::read<StreamIO> (is, tmp);
    _value.setFilmType (tmp);

    Xdr::read<StreamIO> (is, tmp);
    _value.setPrefix (tmp);

    Xdr::read<StreamIO> (is, tmp);
    _value.setCount (tmp);

    Xdr::read<StreamIO> (is, tmp);
    _value.setPerfOffset (tmp);

    Xdr::read<StreamIO> (is, tmp);
    _value.setPerfsPerFrame (tmp);

    Xdr::read<StreamIO> (is, tmp);
    _value.setPerfsPerCount (tmp);
}